

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O3

void __thiscall
slang::syntax::SyntaxVisitor<PublicDirectiveVisitor>::
visitDefault<slang::syntax::CoverageBinsArraySizeSyntax_const&>
          (SyntaxVisitor<PublicDirectiveVisitor> *this,CoverageBinsArraySizeSyntax *node)

{
  size_t sVar1;
  SyntaxNode *node_00;
  size_t sVar2;
  uint uVar3;
  Token token;
  
  sVar1 = SyntaxNode::getChildCount(&node->super_SyntaxNode);
  if (sVar1 != 0) {
    uVar3 = 1;
    sVar1 = 0;
    do {
      node_00 = SyntaxNode::childNode(&node->super_SyntaxNode,sVar1);
      if (node_00 == (SyntaxNode *)0x0) {
        token = SyntaxNode::childToken(&node->super_SyntaxNode,sVar1);
        if (token.info != (Info *)0x0) {
          PublicDirectiveVisitor::visitToken((PublicDirectiveVisitor *)this,token);
        }
      }
      else {
        detail::visitSyntaxNode<slang::syntax::SyntaxNode_const,PublicDirectiveVisitor>
                  (node_00,(PublicDirectiveVisitor *)this);
      }
      sVar1 = (size_t)uVar3;
      sVar2 = SyntaxNode::getChildCount(&node->super_SyntaxNode);
      uVar3 = uVar3 + 1;
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }